

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateRandomUniformStaticLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  bool bVar1;
  int iVar2;
  string *psVar3;
  float fVar4;
  float fVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [8];
  string err_1;
  undefined1 local_68 [8];
  string err;
  RandomUniformStaticLayerParams *params;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *_result;
  
  validateInputCount(__return_storage_ptr__,layer,0,0);
  bVar1 = Result::good(__return_storage_ptr__);
  if (bVar1) {
    Result::~Result(__return_storage_ptr__);
    validateOutputCount(__return_storage_ptr__,layer,1,1);
    bVar1 = Result::good(__return_storage_ptr__);
    if (bVar1) {
      Result::~Result(__return_storage_ptr__);
      err.field_2._8_8_ = Specification::NeuralNetworkLayer::randomuniformstatic(layer);
      iVar2 = Specification::RandomUniformStaticLayerParams::outputshape_size
                        ((RandomUniformStaticLayerParams *)err.field_2._8_8_);
      if (iVar2 == 0) {
        psVar3 = Specification::NeuralNetworkLayer::name_abi_cxx11_(layer);
        __return_storage_ptr___00 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&err_1.field_2 + 8);
        std::operator+(__return_storage_ptr___00,"Target shape is required parameter for \'",psVar3)
        ;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68
                       ,__return_storage_ptr___00,"\' layer.");
        std::__cxx11::string::~string((string *)(err_1.field_2._M_local_buf + 8));
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_68);
        std::__cxx11::string::~string((string *)local_68);
      }
      else {
        fVar4 = Specification::RandomUniformStaticLayerParams::minval
                          ((RandomUniformStaticLayerParams *)err.field_2._8_8_);
        fVar5 = Specification::RandomUniformStaticLayerParams::maxval
                          ((RandomUniformStaticLayerParams *)err.field_2._8_8_);
        if (fVar4 <= fVar5) {
          Result::Result(__return_storage_ptr__);
        }
        else {
          psVar3 = Specification::NeuralNetworkLayer::name_abi_cxx11_(layer);
          std::operator+(&local_c8,"Value of minval should be smaller than maxval for \'",psVar3);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_a8,&local_c8,"\' layer.");
          std::__cxx11::string::~string((string *)&local_c8);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_a8);
          std::__cxx11::string::~string((string *)local_a8);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateRandomUniformStaticLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 0, 0));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    const auto& params = layer.randomuniformstatic();
    if (params.outputshape_size() == 0) {
        const std::string err = "Target shape is required parameter for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (params.minval() > params.maxval()) {
        const std::string err = "Value of minval should be smaller than maxval for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    return Result();
}